

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int CBB_add_asn1_int64_with_tag(CBB *cbb,int64_t value,CBS_ASN1_TAG tag)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  anon_union_32_2_4f6aaa2e_for_u *paVar5;
  bool bVar6;
  uint8_t bytes [8];
  CBB child;
  undefined8 uStack_60;
  int64_t local_58;
  CBB local_50;
  
  if (-1 < value) {
    iVar2 = CBB_add_asn1_uint64_with_tag(cbb,value,tag);
    return iVar2;
  }
  local_58 = value;
  uVar4 = 7;
  while (uVar3 = (uint)uVar4, uVar3 != 0) {
    if ((*(char *)((long)&local_58 + uVar4) != -1) ||
       (uVar4 = (ulong)(uVar3 - 1), -1 < *(char *)((long)&local_58 + uVar4))) goto LAB_0046d70c;
  }
  uVar3 = 0;
LAB_0046d70c:
  uStack_60 = 0x46d719;
  iVar2 = CBB_add_asn1(cbb,&local_50,tag);
  if (iVar2 == 0) {
LAB_0046d77a:
    paVar5 = &cbb->u;
    if (cbb->is_child != '\0') {
      paVar5 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar5->base).buf;
    }
    *(byte *)((long)paVar5 + 0x18) = *(byte *)((long)paVar5 + 0x18) | 2;
    cbb->child = (CBB *)0x0;
    iVar2 = 0;
  }
  else {
    if (-1 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
      uStack_60 = 0x46d739;
      iVar2 = cbb_add_u(&local_50,(ulong)*(byte *)((long)&local_58 + uVar4),1);
      if (iVar2 == 0) {
        bVar6 = SUB41(uVar3 >> 0x1f,0);
      }
      else {
        do {
          bVar6 = (long)uVar4 < 1;
          if ((long)uVar4 < 1) goto LAB_0046d770;
          lVar1 = uVar4 + 7;
          uVar4 = uVar4 - 1;
          uStack_60 = 0x46d761;
          iVar2 = cbb_add_u(&local_50,(ulong)*(byte *)((long)&uStack_60 + lVar1),1);
        } while (iVar2 != 0);
      }
      if (bVar6 == false) goto LAB_0046d77a;
    }
LAB_0046d770:
    uStack_60 = 0x46d778;
    iVar2 = CBB_flush(cbb);
  }
  return iVar2;
}

Assistant:

int CBB_add_asn1_int64_with_tag(CBB *cbb, int64_t value, CBS_ASN1_TAG tag) {
  if (value >= 0) {
    return CBB_add_asn1_uint64_with_tag(cbb, (uint64_t)value, tag);
  }

  uint8_t bytes[sizeof(int64_t)];
  memcpy(bytes, &value, sizeof(value));
  int start = 7;
  // Skip leading sign-extension bytes unless they are necessary.
  while (start > 0 && (bytes[start] == 0xff && (bytes[start - 1] & 0x80))) {
    start--;
  }

  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }
  for (int i = start; i >= 0; i--) {
    if (!CBB_add_u8(&child, bytes[i])) {
      goto err;
    }
  }
  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}